

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_ws.hpp
# Opt level: O1

void __thiscall
SimpleWeb::
SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
::start(SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
        *this,function<void_()> *callback)

{
  mutex *__mutex;
  bool bVar1;
  bool bVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  impl_type *piVar3;
  element_type *peVar4;
  io_context *piVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  int iVar7;
  undefined8 uVar8;
  error_code __ec;
  io_context *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_60 [4];
  error_code local_40;
  
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)&this->start_stop_mutex);
  if (iVar7 == 0) {
    if ((this->io_service).super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        == (element_type *)0x0) {
      local_68 = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<asio::io_context,std::allocator<asio::io_context>>
                (a_Stack_60,&local_68,(allocator<asio::io_context> *)&local_40);
      _Var6._M_pi = a_Stack_60[0]._M_pi;
      piVar5 = local_68;
      local_68 = (element_type *)0x0;
      a_Stack_60[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = (this->io_service).super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (this->io_service).super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           piVar5;
      (this->io_service).super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var6._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if (a_Stack_60[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_60[0]._M_pi);
      }
      this->internal_io_service = true;
    }
    piVar3 = ((this->io_service).super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->impl_;
    bVar1 = (piVar3->mutex_).enabled_;
    if (bVar1 == true) {
      pthread_mutex_lock((pthread_mutex_t *)&(piVar3->mutex_).mutex_);
    }
    bVar2 = piVar3->stopped_;
    if (bVar1 != false) {
      pthread_mutex_unlock((pthread_mutex_t *)&(piVar3->mutex_).mutex_);
    }
    if (bVar2 != false) {
      piVar3 = ((this->io_service).super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->impl_;
      if ((piVar3->mutex_).enabled_ == true) {
        __mutex = &(piVar3->mutex_).mutex_;
        pthread_mutex_lock((pthread_mutex_t *)__mutex);
        piVar3->stopped_ = false;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      }
      else {
        piVar3->stopped_ = false;
      }
    }
    (*this->_vptr_SocketClientBase[2])(this);
    if ((callback->super__Function_base)._M_manager != (_Manager_type)0x0) {
      local_68 = (this->io_service).super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
      a_Stack_60[0]._M_pi = a_Stack_60[0]._M_pi & 0xffffffff;
      asio::detail::
      initiate_post_with_executor<asio::io_context::basic_executor_type<std::allocator<void>,0u>>::
      operator()((initiate_post_with_executor<asio::io_context::basic_executor_type<std::allocator<void>,0u>>
                  *)&local_68,callback,(type *)0x0,(type *)0x0);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->start_stop_mutex);
    if (this->internal_io_service == true) {
      peVar4 = (this->io_service).super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_40._M_value = 0;
      local_40._M_cat = (error_category *)std::_V2::system_category();
      asio::detail::scheduler::run(peVar4->impl_,&local_40);
      __ec._4_4_ = 0;
      __ec._M_value = local_40._M_value;
      if (local_40._M_value != 0) {
        __ec._M_cat = local_40._M_cat;
        std::system_error::system_error((system_error *)&local_68,__ec);
        asio::detail::throw_exception<std::system_error>((system_error *)&local_68);
        std::system_error::~system_error((system_error *)&local_68);
      }
    }
    return;
  }
  uVar8 = std::__throw_system_error(iVar7);
  std::system_error::~system_error((system_error *)&local_68);
  _Unwind_Resume(uVar8);
}

Assistant:

void start(std::function<void()> callback = nullptr) {
      {
        std::lock_guard<std::mutex> lock(start_stop_mutex);

        if(!io_service) {
          io_service = std::make_shared<io_context>();
          internal_io_service = true;
        }

        if(io_service->stopped())
          restart(*io_service);

        connect();

        if(callback)
          post(*io_service, std::move(callback));
      }

      if(internal_io_service)
        io_service->run();
    }